

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O0

int Cec_ManSimClassRefineOne(Cec_ManSim_t *p,int i)

{
  int iVar1;
  uint *p0;
  uint *p1;
  int local_34;
  int Ent;
  uint *pSim1;
  uint *pSim0;
  int i_local;
  Cec_ManSim_t *p_local;
  
  Vec_IntClear(p->vClassOld);
  Vec_IntClear(p->vClassNew);
  Vec_IntPush(p->vClassOld,i);
  p0 = Cec_ObjSim(p,i);
  iVar1 = Gia_ObjIsHead(p->pAig,i);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsHead(p->pAig, i)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                  ,0x114,"int Cec_ManSimClassRefineOne(Cec_ManSim_t *, int)");
  }
  for (local_34 = Gia_ObjNext(p->pAig,i); local_34 != 0; local_34 = Gia_ObjNext(p->pAig,local_34)) {
    p1 = Cec_ObjSim(p,local_34);
    iVar1 = Cec_ManSimCompareEqual(p0,p1,p->nWords);
    if (iVar1 == 0) {
      Vec_IntPush(p->vClassNew,local_34);
      if (p->pBestState != (Abc_Cex_t *)0x0) {
        Cec_ManSimCompareEqualScore(p0,p1,p->nWords,p->pScores);
      }
    }
    else {
      Vec_IntPush(p->vClassOld,local_34);
    }
  }
  iVar1 = Vec_IntSize(p->vClassNew);
  if (iVar1 == 0) {
    p_local._4_4_ = 0;
  }
  else {
    Cec_ManSimClassCreate(p->pAig,p->vClassOld);
    Cec_ManSimClassCreate(p->pAig,p->vClassNew);
    iVar1 = Vec_IntSize(p->vClassNew);
    if (iVar1 < 2) {
      p_local._4_4_ = 1;
    }
    else {
      iVar1 = Vec_IntEntry(p->vClassNew,0);
      iVar1 = Cec_ManSimClassRefineOne(p,iVar1);
      p_local._4_4_ = iVar1 + 1;
    }
  }
  return p_local._4_4_;
}

Assistant:

int Cec_ManSimClassRefineOne( Cec_ManSim_t * p, int i )
{
    unsigned * pSim0, * pSim1;
    int Ent;
    Vec_IntClear( p->vClassOld );
    Vec_IntClear( p->vClassNew );
    Vec_IntPush( p->vClassOld, i );
    pSim0 = Cec_ObjSim(p, i);
    Gia_ClassForEachObj1( p->pAig, i, Ent )
    {
        pSim1 = Cec_ObjSim(p, Ent);
        if ( Cec_ManSimCompareEqual( pSim0, pSim1, p->nWords ) )
            Vec_IntPush( p->vClassOld, Ent );
        else
        {
            Vec_IntPush( p->vClassNew, Ent );
            if ( p->pBestState )
                Cec_ManSimCompareEqualScore( pSim0, pSim1, p->nWords, p->pScores );
        }
    }
    if ( Vec_IntSize( p->vClassNew ) == 0 )
        return 0;
    Cec_ManSimClassCreate( p->pAig, p->vClassOld );
    Cec_ManSimClassCreate( p->pAig, p->vClassNew );
    if ( Vec_IntSize(p->vClassNew) > 1 )
        return 1 + Cec_ManSimClassRefineOne( p, Vec_IntEntry(p->vClassNew,0) );
    return 1;
}